

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sed_lb_ed_test.cc
# Opt level: O1

int main(void)

{
  int iVar1;
  reference_wrapper<node::Node<label::StringLabel>_> *__nptr;
  char cVar2;
  char cVar3;
  bool bVar4;
  istream *piVar5;
  int *piVar6;
  ostream *poVar7;
  undefined8 uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  string input_tree_1_string;
  string input_tree_2_string;
  string line;
  CostModel ucm;
  Node<label::StringLabel> t2;
  Node<label::StringLabel> t1;
  TreeIndexSED ti1;
  BracketNotationParser<label::StringLabel> bnp;
  TreeIndexSED ti2;
  SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED> sed_algorithm;
  LabelDictionary ld;
  ifstream test_cases_file;
  string local_4c0;
  string local_4a0;
  reference_wrapper<node::Node<label::StringLabel>_> *local_480;
  long local_478;
  reference_wrapper<node::Node<label::StringLabel>_> local_470 [2];
  UnitCostModelLD<label::StringLabel> local_460;
  Node<label::StringLabel> local_458;
  Node<label::StringLabel> local_420;
  TreeIndexSED local_3e8;
  BracketNotationParser<label::StringLabel> local_3a8;
  TreeIndexSED local_2e8;
  SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED> local_2a8;
  LabelDictionary<label::StringLabel> local_290;
  long local_238 [65];
  
  local_290.label_to_id_dictionary_._M_h._M_buckets =
       &local_290.label_to_id_dictionary_._M_h._M_single_bucket;
  local_290.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  local_290.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_290.label_to_id_dictionary_._M_h._M_element_count = 0;
  local_290.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_290.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  local_290.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_290.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_290.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_290.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_290._76_8_ = 0;
  local_460.ld_ = &local_290;
  std::ifstream::ifstream((istream *)local_238,"sed_lb_ed_test_data.txt",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error while opening file.",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    iVar9 = -1;
    std::ostream::flush();
  }
  else {
    local_2a8.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.c_ =
         &local_460;
    local_2a8.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>.
    _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_00108d70;
    local_3e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.super_PreLToLabelId.prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_480 = local_470;
    local_478 = 0;
    local_470[0]._M_data._0_1_ = 0;
    iVar9 = 0;
    do {
      do {
        cVar2 = (char)(istream *)local_238;
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_480,cVar3);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          iVar9 = 0;
          goto LAB_00102c42;
        }
      } while (*(char *)&local_480->_M_data != '#');
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_480,cVar3);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4c0,local_480,(long)&local_480->_M_data + local_478);
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_480,cVar3);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a0,local_480,(long)&local_480->_M_data + local_478);
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_480,cVar2);
      __nptr = local_480;
      piVar6 = __errno_location();
      iVar1 = *piVar6;
      *piVar6 = 0;
      dVar10 = strtod((char *)__nptr,(char **)&local_3a8);
      if (local_3a8.node_stack.
          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_00102d15:
        uVar8 = std::__throw_out_of_range("stod");
        parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if (local_480 != local_470) {
          operator_delete(local_480,
                          CONCAT71(local_470[0]._M_data._1_7_,local_470[0]._M_data._0_1_) + 1);
        }
        node::TreeIndexSED::~TreeIndexSED(&local_2e8);
        node::TreeIndexSED::~TreeIndexSED(&local_3e8);
        std::ifstream::~ifstream(local_238);
        std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector
                  (&local_290.id_to_label_dictionary_);
        std::
        _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_290);
        _Unwind_Resume(uVar8);
      }
      if (*piVar6 == 0) {
        *piVar6 = iVar1;
      }
      else if (*piVar6 == 0x22) goto LAB_00102d15;
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&local_3a8);
      bVar4 = parser::BracketNotationParser<label::StringLabel>::validate_input
                        (&local_3a8,&local_4c0);
      if (bVar4) {
        bVar4 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          (&local_3a8,&local_4a0);
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Incorrect format of destination tree: \'",0x27);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_4a0._M_dataplus._M_p,
                              local_4a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\'. Is the number of opening and closing brackets equal?",0x37);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          goto LAB_00102aaf;
        }
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&local_420,&local_3a8,&local_4c0);
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&local_458,&local_3a8,&local_4a0);
        node::
        index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&local_3e8,&local_420,&local_290,&local_460);
        node::
        index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&local_2e8,&local_458,&local_290,&local_460);
        dVar11 = ted_lb::
                 SEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSED>::
                 ted(&local_2a8,&local_3e8,&local_2e8);
        if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Incorrect SED result: ",0x16);
          poVar7 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," instead of ",0xc);
          poVar7 = std::ostream::_M_insert<double>(dVar10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_4c0._M_dataplus._M_p,
                              local_4c0._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_4a0._M_dataplus._M_p,
                              local_4a0._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          iVar9 = -1;
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458.label_.label_._M_dataplus._M_p != &local_458.label_.label_.field_2) {
          operator_delete(local_458.label_.label_._M_dataplus._M_p,
                          local_458.label_.label_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector(&local_458.children_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420.label_.label_._M_dataplus._M_p != &local_420.label_.label_.field_2) {
          operator_delete(local_420.label_.label_._M_dataplus._M_p,
                          local_420.label_.label_.field_2._M_allocated_capacity + 1);
        }
        bVar4 = dVar10 == dVar11;
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector(&local_420.children_);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Incorrect format of source tree: \'",0x22);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_4c0._M_dataplus._M_p,
                            local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\'. Is the number of opening and closing brackets equal?",0x37);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
LAB_00102aaf:
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar9 = -1;
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.kMatchRightBracket._M_dataplus._M_p != &local_3a8.kMatchRightBracket.field_2)
      {
        operator_delete(local_3a8.kMatchRightBracket._M_dataplus._M_p,
                        local_3a8.kMatchRightBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.kMatchLeftBracket._M_dataplus._M_p != &local_3a8.kMatchLeftBracket.field_2) {
        operator_delete(local_3a8.kMatchLeftBracket._M_dataplus._M_p,
                        local_3a8.kMatchLeftBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.kStructureElements._M_dataplus._M_p != &local_3a8.kStructureElements.field_2)
      {
        operator_delete(local_3a8.kStructureElements._M_dataplus._M_p,
                        local_3a8.kStructureElements.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.kRightBracket._M_dataplus._M_p != &local_3a8.kRightBracket.field_2) {
        operator_delete(local_3a8.kRightBracket._M_dataplus._M_p,
                        local_3a8.kRightBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.kLeftBracket._M_dataplus._M_p != &local_3a8.kLeftBracket.field_2) {
        operator_delete(local_3a8.kLeftBracket._M_dataplus._M_p,
                        local_3a8.kLeftBracket.field_2._M_allocated_capacity + 1);
      }
      if (local_3a8.node_stack.
          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (reference_wrapper<node::Node<label::StringLabel>_> *)0x0) {
        operator_delete(local_3a8.node_stack.
                        super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3a8.node_stack.
                              super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3a8.node_stack.
                              super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
    } while (bVar4);
LAB_00102c42:
    if (local_480 != local_470) {
      operator_delete(local_480,CONCAT71(local_470[0]._M_data._1_7_,local_470[0]._M_data._0_1_) + 1)
      ;
    }
    if (local_2e8.super_PostLToLabelId.postl_to_label_id_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_2e8.super_PostLToLabelId.postl_to_label_id_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_2e8.super_PostLToLabelId.postl_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_2e8.super_PostLToLabelId.postl_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (local_2e8.super_PreLToLabelId.prel_to_label_id_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_2e8.super_PreLToLabelId.prel_to_label_id_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_2e8.super_PreLToLabelId.prel_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_2e8.super_PreLToLabelId.prel_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (local_3e8.super_PostLToLabelId.postl_to_label_id_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_3e8.super_PostLToLabelId.postl_to_label_id_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_3e8.super_PostLToLabelId.postl_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_3e8.super_PostLToLabelId.postl_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (local_3e8.super_PreLToLabelId.prel_to_label_id_.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_3e8.super_PreLToLabelId.prel_to_label_id_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_3e8.super_PreLToLabelId.prel_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_3e8.super_PreLToLabelId.prel_to_label_id_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
  }
  std::ifstream::~ifstream(local_238);
  std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector
            (&local_290.id_to_label_dictionary_);
  std::
  _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_290);
  return iVar9;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("sed_lb_ed_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise String Edit Distance algorithm.
  ted_lb::SEDTreeIndex<CostModel, node::TreeIndexSED> sed_algorithm(ucm);
  
  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexSED ti1;
  node::TreeIndexSED ti2;

  // Read test cases from a file line by line.
  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      // Read the single test case.
      std::getline(test_cases_file, line);
      std::string input_tree_1_string = line;
      std::getline(test_cases_file, line);
      std::string input_tree_2_string = line;
      std::getline(test_cases_file, line);
      double correct_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test trees.
      if (!bnp.validate_input(input_tree_1_string)) {
        std::cerr << "Incorrect format of source tree: '" << input_tree_1_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      if (!bnp.validate_input(input_tree_2_string)) {
        std::cerr << "Incorrect format of destination tree: '" << input_tree_2_string << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(input_tree_1_string);
      node::Node<Label> t2 = bnp.parse_single(input_tree_2_string);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm.
      double computed_results = sed_algorithm.ted(ti1, ti2);

      if (correct_result != computed_results) {
        std::cerr << "Incorrect SED result: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree_1_string << std::endl;
        std::cerr << input_tree_2_string << std::endl;
        return -1;
      }
    }
  }

  return 0;
}